

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_loop.cpp
# Opt level: O2

void __thiscall EventLoop::EventLoop(EventLoop *this)

{
  int iVar1;
  Epoll *this_00;
  pthread_t pVar2;
  Logger *pLVar3;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  this_00 = (Epoll *)operator_new(0x88);
  Epoll::Epoll(this_00);
  std::__shared_ptr<Epoll,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Epoll,void>
            ((__shared_ptr<Epoll,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  this->el_quit = false;
  pVar2 = pthread_self();
  (this->el_tid)._M_thread = pVar2;
  (this->el_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  (this->el_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->el_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->el_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->el_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  (this->el_task_funcs).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->el_task_funcs).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->el_task_funcs).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->el_task_funcs).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  iVar1 = eventfd(0,0x80800);
  this->el_evfd = iVar1;
  if (-1 < iVar1) {
    pLVar3 = Logger::get_instance();
    if ((pLVar3->l_inited == false) && (-1 < pr_level)) {
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","EventLoop",0x13);
    }
    if (1 < (int)g_log_level) {
      pLVar3 = Logger::get_instance();
      Logger::write_log(pLVar3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/event_loop.cpp"
                        ,"EventLoop",0x13,LOG_LEVEL_INFO,"create one eventloop, event fd is %d\n",
                        this->el_evfd);
      pLVar3 = Logger::get_instance();
      Logger::flush(pLVar3);
    }
    local_38._8_8_ = 0;
    local_20 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/event_loop.cpp:20:59)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/event_loop.cpp:20:59)>
               ::_M_manager;
    local_38._M_unused._M_object = this;
    Epoll::epoll_add((this->el_epoller).super___shared_ptr<Epoll,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     ,this->el_evfd,1,(EventCallback *)&local_38);
    std::_Function_base::~_Function_base((_Function_base *)&local_38);
    return;
  }
  if (-1 < pr_level) {
    printf("[%-5s][%s:%d] fail to create event_fd\n","error","EventLoop",0x10);
  }
  exit(1);
}

Assistant:

EventLoop::EventLoop() : el_epoller(new Epoll()) {
    if(el_evfd = { eventfd(0, EFD_NONBLOCK | EFD_CLOEXEC) }; el_evfd < 0)
    {
        PR_ERROR("fail to create event_fd\n");
        exit(1);
    }
LOG_INFO("create one eventloop, event fd is %d\n", el_evfd);
    el_epoller->epoll_add(el_evfd, EPOLLIN /*| EPOLLET*/, [this](){ this->evfd_read(); });
}